

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  PyTypeObject *pPVar1;
  type_info *__rhs;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  PyObject **ppPVar6;
  undefined8 uVar7;
  char *pcVar8;
  reference pvVar9;
  type_info *ptVar10;
  PyMethodDef *pPVar11;
  _func_void_void_ptr *destructor;
  PyObject *pPVar12;
  size_t sVar13;
  PyObject *pPVar14;
  PyTypeObject *local_720;
  byte local_6b1;
  char *local_6a8;
  PyCFunctionObject *func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670 [32];
  handle local_650;
  function_record *it;
  string local_640 [3];
  bool first_user_def;
  int index;
  string signatures;
  allocator local_619;
  string local_618 [32];
  str_attr_accessor local_5f8;
  str local_5d8;
  str local_5d0 [4];
  allocator local_5a9;
  string local_5a8 [32];
  char local_588 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8 [32];
  str_attr_accessor local_4c8;
  object local_4a8;
  PyObject *local_4a0;
  str_attr_accessor local_498;
  object local_478;
  PyObject *local_470;
  handle local_468;
  object scope_module;
  handle local_458;
  capsule rec_capsule_1;
  string local_448 [32];
  char local_428 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408 [32];
  handle local_3e8;
  capsule local_3e0;
  capsule rec_capsule;
  function_record *chain_start;
  function_record *chain;
  allocator local_3b9;
  string local_3b8 [8];
  string tname;
  str_attr_accessor local_398;
  accessor<pybind11::detail::accessor_policies::str_attr> local_378;
  str_attr_accessor local_358;
  accessor<pybind11::detail::accessor_policies::str_attr> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8 [32];
  str_attr_accessor local_2d8;
  accessor<pybind11::detail::accessor_policies::str_attr> local_2b8;
  str_attr_accessor local_298;
  accessor<pybind11::detail::accessor_policies::str_attr> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [32];
  handle local_218;
  handle th;
  type_info *tinfo;
  type_info *t;
  string local_1d8 [39];
  char local_1b1;
  char *pcStack_1b0;
  char c;
  char *pc;
  size_t arg_index;
  size_t type_index;
  string signature;
  string local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [39];
  allocator local_f1;
  string local_f0 [8];
  string func_name;
  allocator local_c9;
  string local_c8 [8];
  string class_name;
  str_attr_accessor local_98;
  object local_78;
  object local_70 [4];
  reference local_50;
  argument_record *a;
  iterator __end2;
  iterator __begin2;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__range2;
  size_t args_local;
  type_info **types_local;
  char *text_local;
  function_record *rec_local;
  cpp_function *this_local;
  
  if (rec->name == (char *)0x0) {
    local_6a8 = "";
  }
  else {
    local_6a8 = rec->name;
  }
  pcVar5 = strdup(local_6a8);
  rec->name = pcVar5;
  if (rec->doc != (char *)0x0) {
    pcVar5 = strdup(rec->doc);
    rec->doc = pcVar5;
  }
  __end2 = std::
           vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ::begin(&rec->args);
  a = (argument_record *)
      std::
      vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ::end(&rec->args);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                                     *)&a), bVar3) {
    local_50 = __gnu_cxx::
               __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
               ::operator*(&__end2);
    if (local_50->name != (char *)0x0) {
      pcVar5 = strdup(local_50->name);
      local_50->name = pcVar5;
    }
    if (local_50->descr == (char *)0x0) {
      bVar3 = handle::operator_cast_to_bool(&local_50->value);
      if (bVar3) {
        detail::object_api<pybind11::handle>::attr
                  (&local_98,(object_api<pybind11::handle> *)&local_50->value,"__repr__");
        detail::
        object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
        operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                    *)&local_78);
        object::cast<std::__cxx11::string>(local_70);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        pcVar5 = strdup(pcVar5);
        local_50->descr = pcVar5;
        std::__cxx11::string::~string((string *)local_70);
        object::~object(&local_78);
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_98);
      }
    }
    else {
      pcVar5 = strdup(local_50->descr);
      local_50->descr = pcVar5;
    }
    __gnu_cxx::
    __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
    ::operator++(&__end2);
  }
  iVar4 = strcmp(rec->name,"__init__");
  local_6b1 = 1;
  if (iVar4 != 0) {
    iVar4 = strcmp(rec->name,"__setstate__");
    local_6b1 = iVar4 != 0 ^ 0xff;
  }
  rec->field_0x59 = rec->field_0x59 & 0xfe | local_6b1 & 1;
  if (((rec->field_0x59 & 1) != 0) && (((byte)rec->field_0x59 >> 1 & 1) == 0)) {
    ppPVar6 = handle::ptr(&rec->scope);
    pPVar1 = (*ppPVar6)[1].ob_type;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,(char *)pPVar1,&local_c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    pcVar5 = rec->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,pcVar5,&local_f1);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    uVar2 = _PyExc_FutureWarning;
    std::operator+((char *)local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "pybind11-bound class \'");
    std::operator+(local_158,(char *)local_178);
    std::operator+(local_138,local_158);
    std::operator+(local_118,(char *)local_138);
    uVar7 = std::__cxx11::string::c_str();
    PyErr_WarnEx(uVar2,uVar7,0);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_c8);
  }
  std::__cxx11::string::string((string *)&type_index);
  arg_index = 0;
  pc = (char *)0x0;
  for (pcStack_1b0 = text; pcVar5 = pc, *pcStack_1b0 != '\0'; pcStack_1b0 = pcStack_1b0 + 1) {
    local_1b1 = *pcStack_1b0;
    if (local_1b1 == '{') {
      if (pcStack_1b0[1] != '*') {
        pcVar8 = (char *)std::
                         vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                         ::size(&rec->args);
        if ((pcVar5 < pcVar8) &&
           (pvVar9 = std::
                     vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ::operator[](&rec->args,(size_type)pc), pvVar9->name != (char *)0x0)) {
          pvVar9 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::operator[](&rec->args,(size_type)pc);
          std::__cxx11::string::operator+=((string *)&type_index,pvVar9->name);
        }
        else if ((pc == (char *)0x0) && (((byte)rec->field_0x59 >> 6 & 1) != 0)) {
          std::__cxx11::string::operator+=((string *)&type_index,"self");
        }
        else {
          std::__cxx11::to_string
                    ((__cxx11 *)&t,(long)pc - (ulong)(((byte)rec->field_0x59 >> 6 & 1) != 0));
          std::operator+((char *)local_1d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"arg")
          ;
          std::__cxx11::string::operator+=((string *)&type_index,local_1d8);
          std::__cxx11::string::~string(local_1d8);
          std::__cxx11::string::~string((string *)&t);
        }
        std::__cxx11::string::operator+=((string *)&type_index,": ");
      }
    }
    else if (local_1b1 == '}') {
      pcVar8 = (char *)std::
                       vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       ::size(&rec->args);
      if ((pcVar5 < pcVar8) &&
         (pvVar9 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::operator[](&rec->args,(size_type)pc), pvVar9->descr != (char *)0x0)) {
        std::__cxx11::string::operator+=((string *)&type_index," = ");
        pvVar9 = std::
                 vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ::operator[](&rec->args,(size_type)pc);
        std::__cxx11::string::operator+=((string *)&type_index,pvVar9->descr);
      }
      pc = pc + 1;
    }
    else if (local_1b1 == '%') {
      __rhs = types[arg_index];
      if (__rhs == (type_info *)0x0) {
        arg_index = arg_index + 1;
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      arg_index = arg_index + 1;
      std::type_index::type_index((type_index *)&th,__rhs);
      ptVar10 = detail::get_type_info((type_index *)&th,false);
      if (ptVar10 == (type_info *)0x0) {
        if ((((byte)rec->field_0x59 >> 1 & 1) == 0) || (pc != (char *)0x0)) {
          pcVar5 = std::type_info::name(__rhs);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3b8,pcVar5,&local_3b9);
          std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
          detail::clean_type_id((string *)local_3b8);
          std::__cxx11::string::operator+=((string *)&type_index,local_3b8);
          std::__cxx11::string::~string(local_3b8);
        }
        else {
          detail::object_api<pybind11::handle>::attr
                    (&local_358,(object_api<pybind11::handle> *)&rec->scope,"__module__");
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>(&local_338);
          std::operator+(local_318,(char *)&local_338);
          detail::object_api<pybind11::handle>::attr
                    (&local_398,(object_api<pybind11::handle> *)&rec->scope,"__qualname__");
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>(&local_378);
          std::operator+(local_2f8,local_318);
          std::__cxx11::string::operator+=((string *)&type_index,(string *)local_2f8);
          std::__cxx11::string::~string((string *)local_2f8);
          std::__cxx11::string::~string((string *)&local_378);
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_398);
          std::__cxx11::string::~string((string *)local_318);
          std::__cxx11::string::~string((string *)&local_338);
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_358);
        }
      }
      else {
        handle::handle(&local_218,(PyObject *)ptVar10->type);
        detail::object_api<pybind11::handle>::attr
                  (&local_298,(object_api<pybind11::handle> *)&local_218,"__module__");
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  (&local_278);
        std::operator+(local_258,(char *)&local_278);
        detail::object_api<pybind11::handle>::attr
                  (&local_2d8,(object_api<pybind11::handle> *)&local_218,"__qualname__");
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  (&local_2b8);
        std::operator+(local_238,local_258);
        std::__cxx11::string::operator+=((string *)&type_index,(string *)local_238);
        std::__cxx11::string::~string((string *)local_238);
        std::__cxx11::string::~string((string *)&local_2b8);
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_2d8);
        std::__cxx11::string::~string((string *)local_258);
        std::__cxx11::string::~string((string *)&local_278);
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_298);
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)&type_index,local_1b1);
    }
  }
  if ((pc == (char *)args) && (types[arg_index] == (type_info *)0x0)) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pcVar5 = strdup(pcVar5);
    rec->signature = pcVar5;
    std::
    vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>::
    shrink_to_fit(&rec->args);
    rec->nargs = (uint16_t)args;
    bVar3 = handle::operator_cast_to_bool(&rec->sibling);
    if (bVar3) {
      ppPVar6 = handle::ptr(&rec->sibling);
      iVar4 = _Py_IS_TYPE(*ppPVar6,(PyTypeObject *)&PyInstanceMethod_Type);
      if (iVar4 != 0) {
        ppPVar6 = handle::ptr(&rec->sibling);
        handle::handle((handle *)&chain,(PyObject *)(*ppPVar6)[1].ob_refcnt);
        (rec->sibling).m_ptr = (PyObject *)chain;
      }
    }
    chain_start = (function_record *)0x0;
    rec_capsule.super_object.super_handle.m_ptr = (object)(object)rec;
    bVar3 = handle::operator_cast_to_bool(&rec->sibling);
    if (bVar3) {
      ppPVar6 = handle::ptr(&rec->sibling);
      iVar4 = _PyObject_TypeCheck(*ppPVar6,(PyTypeObject *)&PyCFunction_Type);
      if (iVar4 == 0) {
        bVar3 = detail::object_api<pybind11::handle>::is_none
                          ((object_api<pybind11::handle> *)&rec->sibling);
        if ((!bVar3) && (*rec->name != '_')) {
          pcVar5 = rec->name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_448,pcVar5,
                     (allocator *)((long)&rec_capsule_1.super_object.super_handle.m_ptr + 7));
          std::operator+(local_428,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Cannot overload existing non-function object \"");
          std::operator+(local_408,local_428);
          pybind11_fail(local_408);
        }
      }
      else {
        ppPVar6 = handle::ptr(&rec->sibling);
        if ((*(uint *)((*ppPVar6)[1].ob_refcnt + 0x10) & 0x20) == 0) {
          ppPVar6 = handle::ptr(&rec->sibling);
          local_720 = (*ppPVar6)[1].ob_type;
        }
        else {
          local_720 = (PyTypeObject *)0x0;
        }
        handle::handle(&local_3e8,(PyObject *)local_720);
        reinterpret_borrow<pybind11::capsule>((pybind11 *)&local_3e0,local_3e8);
        chain_start = capsule::operator_cast_to_function_record_(&local_3e0);
        bVar3 = detail::object_api<pybind11::handle>::is
                          ((object_api<pybind11::handle> *)&chain_start->scope,
                           (object_api<pybind11::handle> *)&rec->scope);
        if (!bVar3) {
          chain_start = (function_record *)0x0;
        }
        capsule::~capsule(&local_3e0);
      }
    }
    if (chain_start == (function_record *)0x0) {
      pPVar11 = (PyMethodDef *)operator_new(0x20);
      *(undefined8 *)&pPVar11->ml_flags = 0;
      pPVar11->ml_doc = (char *)0x0;
      pPVar11->ml_name = (char *)0x0;
      pPVar11->ml_meth = (PyCFunction)0x0;
      rec->def = pPVar11;
      pPVar11 = rec->def;
      *(undefined8 *)&pPVar11->ml_flags = 0;
      pPVar11->ml_doc = (char *)0x0;
      pPVar11->ml_name = (char *)0x0;
      pPVar11->ml_meth = (PyCFunction)0x0;
      rec->def->ml_name = rec->name;
      rec->def->ml_meth = dispatcher;
      rec->def->ml_flags = 3;
      destructor = initialize_generic(pybind11::detail::function_record*,char_const*,std::type_info_const*const*,unsigned_long)
                   ::{lambda(void*)#1}::operator_cast_to_function_pointer
                             ((_lambda_void___1_ *)((long)&scope_module.super_handle.m_ptr + 7));
      capsule::capsule((capsule *)&local_458,rec,destructor);
      object::object((object *)&local_468);
      bVar3 = handle::operator_cast_to_bool(&rec->scope);
      if (bVar3) {
        local_470 = (rec->scope).m_ptr;
        bVar3 = hasattr((handle)local_470,"__module__");
        if (bVar3) {
          detail::object_api<pybind11::handle>::attr
                    (&local_498,(object_api<pybind11::handle> *)&rec->scope,"__module__");
          detail::accessor::operator_cast_to_object((accessor *)&local_478);
          object::operator=((object *)&local_468,&local_478);
          object::~object(&local_478);
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_498);
        }
        else {
          local_4a0 = (rec->scope).m_ptr;
          bVar3 = hasattr((handle)local_4a0,"__name__");
          if (bVar3) {
            detail::object_api<pybind11::handle>::attr
                      (&local_4c8,(object_api<pybind11::handle> *)&rec->scope,"__name__");
            detail::accessor::operator_cast_to_object((accessor *)&local_4a8);
            object::operator=((object *)&local_468,&local_4a8);
            object::~object(&local_4a8);
            detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_4c8);
          }
        }
      }
      pPVar11 = rec->def;
      ppPVar6 = handle::ptr(&local_458);
      pPVar12 = *ppPVar6;
      ppPVar6 = handle::ptr(&local_468);
      pPVar12 = (PyObject *)PyCMethod_New(pPVar11,pPVar12,*ppPVar6,0);
      (this->super_function).super_object.super_handle.m_ptr = pPVar12;
      if ((this->super_function).super_object.super_handle.m_ptr == (PyObject *)0x0) {
        pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
      }
      object::~object((object *)&local_468);
      capsule::~capsule((capsule *)&local_458);
    }
    else {
      ppPVar6 = handle::ptr(&rec->sibling);
      (this->super_function).super_object.super_handle.m_ptr = *ppPVar6;
      handle::inc_ref((handle *)this);
      rec_capsule.super_object.super_handle.m_ptr = (object)(object)chain_start;
      if (((byte)chain_start->field_0x59 >> 6 & 1) != ((byte)rec->field_0x59 >> 6 & 1)) {
        pcVar5 = "static";
        if (((byte)rec->field_0x59 >> 6 & 1) != 0) {
          pcVar5 = "instance";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5a8,pcVar5,&local_5a9);
        std::operator+(local_588,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                      );
        std::operator+(local_568,local_588);
        detail::object_api<pybind11::handle>::attr
                  (&local_5f8,(object_api<pybind11::handle> *)&rec->scope,"__name__");
        str::str<pybind11::detail::accessor_policies::str_attr>(&local_5d8,&local_5f8);
        str::operator_cast_to_string(local_5d0);
        std::operator+(local_548,local_568);
        std::operator+(local_528,(char *)local_548);
        pcVar5 = rec->name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_618,pcVar5,&local_619);
        std::operator+(local_508,local_528);
        std::operator+(local_4e8,local_508);
        pybind11_fail(local_4e8);
      }
      for (; chain_start->next != (function_record *)0x0; chain_start = chain_start->next) {
      }
      chain_start->next = rec;
    }
    std::__cxx11::string::string(local_640);
    it._4_4_ = 0;
    if ((chain_start != (function_record *)0x0) &&
       (bVar3 = options::show_function_signatures(), bVar3)) {
      std::__cxx11::string::operator+=(local_640,rec->name);
      std::__cxx11::string::operator+=(local_640,"(*args, **kwargs)\n");
      std::__cxx11::string::operator+=(local_640,"Overloaded function.\n\n");
    }
    it._3_1_ = 1;
    for (local_650.m_ptr = (PyObject *)rec_capsule.super_object.super_handle.m_ptr;
        local_650.m_ptr != (PyObject *)0x0; local_650.m_ptr = (PyObject *)local_650.m_ptr[7].ob_type
        ) {
      bVar3 = options::show_function_signatures();
      if (bVar3) {
        if (0 < it._4_4_) {
          std::__cxx11::string::operator+=(local_640,"\n");
        }
        if (chain_start != (function_record *)0x0) {
          it._4_4_ = it._4_4_ + 1;
          std::__cxx11::to_string((__cxx11 *)&func,it._4_4_);
          std::operator+(local_670,(char *)&func);
          std::__cxx11::string::operator+=(local_640,(string *)local_670);
          std::__cxx11::string::~string((string *)local_670);
          std::__cxx11::string::~string((string *)&func);
        }
        std::__cxx11::string::operator+=(local_640,rec->name);
        std::__cxx11::string::operator+=(local_640,(char *)local_650.m_ptr[1].ob_refcnt);
        std::__cxx11::string::operator+=(local_640,"\n");
      }
      if ((((local_650.m_ptr)->ob_type != (PyTypeObject *)0x0) &&
          (sVar13 = strlen((char *)(local_650.m_ptr)->ob_type), sVar13 != 0)) &&
         (bVar3 = options::show_user_defined_docstrings(), bVar3)) {
        bVar3 = options::show_function_signatures();
        if (!bVar3) {
          if ((it._3_1_ & 1) == 0) {
            std::__cxx11::string::operator+=(local_640,"\n");
          }
          else {
            it._3_1_ = 0;
          }
        }
        bVar3 = options::show_function_signatures();
        if (bVar3) {
          std::__cxx11::string::operator+=(local_640,"\n");
        }
        std::__cxx11::string::operator+=(local_640,(char *)(local_650.m_ptr)->ob_type);
        bVar3 = options::show_function_signatures();
        if (bVar3) {
          std::__cxx11::string::operator+=(local_640,"\n");
        }
      }
    }
    pPVar12 = (this->super_function).super_object.super_handle.m_ptr;
    if (*(long *)(pPVar12[1].ob_refcnt + 0x18) != 0) {
      free(*(void **)(pPVar12[1].ob_refcnt + 0x18));
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pcVar5 = strdup(pcVar5);
    *(char **)(pPVar12[1].ob_refcnt + 0x18) = pcVar5;
    if (((byte)rec->field_0x59 >> 6 & 1) != 0) {
      pPVar14 = (PyObject *)
                PyInstanceMethod_New((this->super_function).super_object.super_handle.m_ptr);
      (this->super_function).super_object.super_handle.m_ptr = pPVar14;
      if ((this->super_function).super_object.super_handle.m_ptr == (PyObject *)0x0) {
        pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
      }
      _Py_DECREF(pPVar12);
    }
    std::__cxx11::string::~string(local_640);
    std::__cxx11::string::~string((string *)&type_index);
    return;
  }
  pybind11_fail("Internal error while parsing type signature (2)");
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(a.value.attr("__repr__")().cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = std::string(((PyTypeObject *) rec->scope.ptr())->tp_name);
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;

                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }
        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            chain_start = chain;
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );
            while (chain->next)
                chain = chain->next;
            chain->next = rec;
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        PyCFunctionObject *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }